

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O2

Vec4 __thiscall
deqp::gls::InteractionTestUtil::getRandomColor(InteractionTestUtil *this,Random *rnd)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  Vec4 VVar4;
  
  fVar1 = de::Random::choose<float,float_const*>
                    (rnd,getRandomColor::components,(float *)&DAT_00a2d3ec);
  fVar2 = de::Random::choose<float,float_const*>
                    (rnd,getRandomColor::components,(float *)&DAT_00a2d3ec);
  fVar3 = de::Random::choose<float,float_const*>
                    (rnd,getRandomColor::components,(float *)&DAT_00a2d3ec);
  VVar4.m_data[0] =
       de::Random::choose<float,float_const*>(rnd,getRandomColor::components,(float *)&DAT_00a2d3ec)
  ;
  VVar4.m_data[1] = (float)extraout_XMM0_Db;
  *(float *)this = fVar1;
  *(float *)(this + 4) = fVar2;
  *(float *)(this + 8) = fVar3;
  *(float *)(this + 0xc) = VVar4.m_data[0];
  VVar4.m_data[2] = fVar3;
  VVar4.m_data[3] = 0.0;
  return (Vec4)VVar4.m_data;
}

Assistant:

static Vec4 getRandomColor (de::Random& rnd)
{
	static const float components[] = { 0.0f, 0.2f, 0.4f, 0.5f, 0.6f, 0.8f, 1.0f };
	float r = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	float g = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	float b = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	float a = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	return Vec4(r, g, b, a);
}